

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BitMask.cpp
# Opt level: O0

void anon_unknown.dwarf_762da::run(void)

{
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  IVar1;
  void *pvVar2;
  RbTreeNode<int,_int> *pRVar3;
  uint *puVar4;
  size_t i_1;
  size_t i;
  MapIteratorX<int,_int> it2;
  Iterator it;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> tree;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  itBase;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  itDerived;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  in_stack_fffffffffffffee8;
  RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *in_stack_fffffffffffffef0;
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  *in_stack_fffffffffffffef8;
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  *in_stack_ffffffffffffff00;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *in_stack_ffffffffffffff08;
  BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
  *this;
  ulong local_a0;
  ulong local_80;
  IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  local_50 [7];
  undefined8 local_18;
  undefined8 local_10;
  
  this = (BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
          *)&stack0xfffffffffffffff8;
  axl::sl::
  Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Derived,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,_axl::sl::ListLink>_>
              *)0x125a89);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
  ::Iterator((Iterator<(anonymous_namespace)::Base,_axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,_axl::sl::ListLink>_>
              *)0x125a96);
  axl::sl::
  Iterator<(anonymous_namespace)::Base,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Base,axl::sl::ListLink>>
  ::
  Iterator<(anonymous_namespace)::Derived,axl::sl::ImplicitPtrCast<(anonymous_namespace)::Derived,axl::sl::ListLink>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_10 = local_18;
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::RbTree
            (in_stack_fffffffffffffef0,(Cmp<int,_int> *)in_stack_fffffffffffffee8.m_p);
  axl::sl::
  Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)0x125ada);
  IVar1.m_p = (Entry *)axl::sl::
                       BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                       ::find(in_stack_ffffffffffffff08,
                              (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  (anonymous_namespace)::MapIteratorX<int,int>::MapIteratorX<axl::sl::RbTreeNode<int,int>>
            ((MapIteratorX<int,_int> *)in_stack_fffffffffffffef0,
             (Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
              *)in_stack_fffffffffffffee8.m_p);
  for (local_80 = 0; local_80 < 0x32; local_80 = local_80 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::visit(this,(int)((ulong)IVar1.m_p >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    axl::sl::
    IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
    ::operator++((IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  *)in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  for (local_a0 = 0; local_a0 < 0x32; local_a0 = local_a0 + 1) {
    rand();
    axl::sl::
    BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
    ::eraseKey(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  local_50[0].
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
  .m_p = (IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
          )axl::sl::
           BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
           ::getHead((BinTreeBase<axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>,_axl::sl::RbTreeNode<int,_int>,_int,_int,_axl::sl::Cmp<int,_int>,_int,_int>
                      *)in_stack_fffffffffffffee8.m_p);
  while( true ) {
    pvVar2 = axl::sl::IteratorBase::operator_cast_to_void_((IteratorBase *)local_50);
    if (pvVar2 == (void *)0x0) break;
    pRVar3 = axl::sl::
             IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
             ::operator->(local_50);
    puVar4 = (uint *)axl::sl::MapEntry<int,_int>::getKey((MapEntry<int,_int> *)pRVar3);
    printf("%d\n",(ulong)*puVar4);
    in_stack_fffffffffffffee8.m_p =
         (Entry *)axl::sl::
                  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<int,_int>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<int,_int>,_axl::sl::ListLink>_>
                  ::operator++(in_stack_fffffffffffffee8.m_p,0);
  }
  printf(".........\n");
  axl::sl::RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int>::~RbTree
            ((RbTree<int,_int,_axl::sl::Cmp<int,_int>,_int,_int> *)0x125dbb);
  return;
}

Assistant:

void run() {
	uint64_t lo64[][2] = {
		{ 0,  0x0000000000000000LL },
		{ 4,  0x000000000000000fLL },
		{ 8,  0x00000000000000ffLL },
		{ 12, 0x0000000000000fffLL },
		{ 16, 0x000000000000ffffLL },
		{ 31, 0x000000007fffffffLL },
		{ 32, 0x00000000ffffffffLL },
		{ 52, 0x000fffffffffffffLL },
		{ 56, 0x00ffffffffffffffLL },
		{ 60, 0x0fffffffffffffffLL },
		{ 63, 0x7fffffffffffffffLL },
		{ 64, 0xffffffffffffffffLL },
	};

	for (size_t i = 0; i < countof(lo64); i++) {
		uint64_t shift = lo64[i][0];
		uint64_t expected = lo64[i][1];
		uint64_t result = sl::getLoBitmask64(shift);
		printf("getLoBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint64_t hi64[][2] = {
		{ 0,  0xffffffffffffffffLL },
		{ 4,  0xfffffffffffffff0LL },
		{ 8,  0xffffffffffffff00LL },
		{ 12, 0xfffffffffffff000LL },
		{ 16, 0xffffffffffff0000LL },
		{ 31, 0xffffffff80000000LL },
		{ 32, 0xffffffff00000000LL },
		{ 52, 0xfff0000000000000LL },
		{ 56, 0xff00000000000000LL },
		{ 60, 0xf000000000000000LL },
		{ 63, 0x8000000000000000LL },
		{ 64, 0x0000000000000000LL },
	};

	for (size_t i = 0; i < countof(hi64); i++) {
		uint64_t shift = hi64[i][0];
		uint64_t expected = hi64[i][1];
		uint64_t result = sl::getHiBitmask64(shift);
		printf("getHiBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t lo32[][2] = {
		{ 0,  0x00000000 },
		{ 4,  0x0000000f },
		{ 8,  0x000000ff },
		{ 12, 0x00000fff },
		{ 16, 0x0000ffff },
		{ 31, 0x7fffffff },
		{ 32, 0xffffffff },
	};

	for (size_t i = 0; i < countof(lo32); i++) {
		uint32_t shift = lo32[i][0];
		uint32_t expected = lo32[i][1];
		uint32_t result = sl::getLoBitmask32(shift);
		printf("getLoBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t hi32[][2] = {
		{ 0,  0xffffffff },
		{ 4,  0xfffffff0 },
		{ 8,  0xffffff00 },
		{ 12, 0xfffff000 },
		{ 16, 0xffff0000 },
		{ 31, 0x80000000 },
		{ 32, 0x00000000 },
	};

	for (size_t i = 0; i < countof(hi32); i++) {
		uint64_t shift = hi32[i][0];
		uint64_t expected = hi32[i][1];
		uint64_t result = sl::getHiBitmask32(shift);
		printf("getHiBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t lo16[][2] = {
		{ 0,  0x0000 },
		{ 4,  0x000f },
		{ 8,  0x00ff },
		{ 12, 0x0fff },
		{ 16, 0xffff },
	};

	for (size_t i = 0; i < countof(lo16); i++) {
		uint16_t shift = lo16[i][0];
		uint16_t expected = lo16[i][1];
		uint16_t result = sl::getLoBitmask16(shift);
		printf("getLoBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t hi16[][2] = {
		{ 0,  0xffff },
		{ 4,  0xfff0 },
		{ 8,  0xff00 },
		{ 12, 0xf000 },
		{ 16, 0x0000 },
	};

	for (size_t i = 0; i < countof(hi16); i++) {
		uint64_t shift = hi16[i][0];
		uint64_t expected = hi16[i][1];
		uint64_t result = sl::getHiBitmask16(shift);
		printf("getHiBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t lo8[][2] = {
		{ 0, 0x00 },
		{ 3, 0x07 },
		{ 4, 0x0f },
		{ 7, 0x7f },
		{ 8, 0xff },
	};

	for (size_t i = 0; i < countof(lo8); i++) {
		uint8_t shift = lo8[i][0];
		uint8_t expected = lo8[i][1];
		uint8_t result = sl::getLoBitmask8(shift);
		printf("getLoBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t hi8[][2] = {
		{ 0, 0xff },
		{ 3, 0xf8 },
		{ 4, 0xf0 },
		{ 7, 0x80 },
		{ 8, 0x00 },
	};

	for (size_t i = 0; i < countof(hi8); i++) {
		uint64_t shift = hi8[i][0];
		uint64_t expected = hi8[i][1];
		uint64_t result = sl::getHiBitmask8(shift);
		printf("getHiBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}
}